

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

double __thiscall
despot::Parser::ObsProb
          (Parser *this,OBS_TYPE obs,vector<int,_std::allocator<int>_> *state,ACT_TYPE action)

{
  pointer piVar1;
  pointer piVar2;
  CPT *pCVar3;
  uint uVar4;
  pointer pNVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  
  piVar1 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = &(((this->curr_state_vars_).
              super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
              super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
  for (lVar7 = 0; (long)piVar2 - (long)piVar1 >> 2 != lVar7; lVar7 = lVar7 + 1) {
    *piVar6 = piVar1[lVar7];
    piVar6 = piVar6 + 0x30;
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  pNVar5 = (this->obs_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->obs_vars_).
                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pNVar5) / 0x78 & 0xffffffff;
  dVar9 = 1.0;
  while( true ) {
    uVar8 = uVar8 - 1;
    if ((int)(uint)uVar8 < 0) break;
    uVar4 = (uint)uVar8 & 0x7fffffff;
    pCVar3 = (this->obs_funcs_).super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar4];
    (*(pCVar3->super_Function)._vptr_Function[5])
              (pCVar3,obs % (ulong)(long)(int)((ulong)((long)pNVar5[uVar4].super_Variable.values_.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  *(long *)&pNVar5[uVar4].super_Variable.values_.
                                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data) >> 5) &
                      0xffffffff);
    pNVar5 = (this->obs_vars_).
             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = dVar9 * extraout_XMM0_Qa;
    obs = obs / (ulong)(long)(int)((ulong)((long)pNVar5[uVar4].super_Variable.values_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          *(long *)&pNVar5[uVar4].super_Variable.values_.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data) >> 5);
  }
  return dVar9;
}

Assistant:

double Parser::ObsProb(OBS_TYPE obs, const vector<int>& state,
	ACT_TYPE action) const {
	for (int s = 0; s < state.size(); s++) {
		curr_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	double prob = 1.0;
	for (int o = obs_vars_.size() - 1; o >= 0; o--) {
		prob *= obs_funcs_[o]->GetValue(obs % obs_vars_[o].Size());
		obs /= obs_vars_[o].Size();
	}
	return prob;
}